

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataTemplatedScatter<duckdb::interval_t>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *param_9,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  byte *pbVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  value_type vVar6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  long lVar9;
  byte bVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  idx_t iVar13;
  idx_t iVar14;
  
  pSVar3 = (source_format->unified).sel;
  pdVar4 = (source_format->unified).data;
  pdVar5 = row_locations->data;
  pvVar12 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  vVar6 = *pvVar12;
  if ((source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (append_count != 0) {
      iVar13 = 0;
      do {
        iVar14 = iVar13;
        if (append_sel->sel_vector != (sel_t *)0x0) {
          iVar14 = (idx_t)append_sel->sel_vector[iVar13];
        }
        psVar7 = pSVar3->sel_vector;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar14];
        }
        lVar9 = *(long *)(pdVar5 + iVar13 * 8);
        pdVar2 = pdVar4 + iVar14 * 0x10;
        uVar11 = *(undefined8 *)(pdVar2 + 8);
        *(undefined8 *)(lVar9 + vVar6) = *(undefined8 *)pdVar2;
        ((undefined8 *)(lVar9 + vVar6))[1] = uVar11;
        iVar13 = iVar13 + 1;
      } while (append_count != iVar13);
    }
  }
  else if (append_count != 0) {
    bVar10 = (byte)col_idx & 7;
    iVar13 = 0;
    do {
      iVar14 = iVar13;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)append_sel->sel_vector[iVar13];
      }
      psVar7 = pSVar3->sel_vector;
      if (psVar7 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar7[iVar14];
      }
      puVar8 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((puVar8[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)) {
        lVar9 = *(long *)(pdVar5 + iVar13 * 8);
        pdVar2 = pdVar4 + iVar14 * 0x10;
        uVar11 = *(undefined8 *)(pdVar2 + 8);
        *(undefined8 *)(lVar9 + vVar6) = *(undefined8 *)pdVar2;
        ((undefined8 *)(lVar9 + vVar6))[1] = uVar11;
      }
      else {
        lVar9 = *(long *)(pdVar5 + iVar13 * 8);
        *(undefined8 *)(lVar9 + vVar6) = 0x8000000080000000;
        *(undefined8 *)(lVar9 + 8 + vVar6) = 0x8000000000000000;
        pbVar1 = (byte *)(*(long *)(pdVar5 + iVar13 * 8) + (col_idx >> 3));
        *pbVar1 = *pbVar1 & (-2 << bVar10 | 0xfeU >> 8 - bVar10);
      }
      iVar13 = iVar13 + 1;
    } while (append_count != iVar13);
  }
  return;
}

Assistant:

static void TupleDataTemplatedScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                      const SelectionVector &append_sel, const idx_t append_count,
                                      const TupleDataLayout &layout, const Vector &row_locations,
                                      Vector &heap_locations, const idx_t col_idx, const UnifiedVectorFormat &,
                                      const vector<TupleDataScatterFunction> &) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	if (validity.AllValid()) {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
		}
	} else {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (validity.RowIsValid(source_idx)) {
				TupleDataValueStore<T>(data[source_idx], target_locations[i], offset_in_row, target_heap_locations[i]);
			} else {
				TupleDataValueStore<T>(NullValue<T>(), target_locations[i], offset_in_row, target_heap_locations[i]);
				ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
			}
		}
	}
}